

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzblockdiag.cpp
# Opt level: O3

int __thiscall
TPZBlockDiagonal<double>::PutVal
          (TPZBlockDiagonal<double> *this,int64_t row,int64_t col,double *value)

{
  double dVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  char *pcVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  
  lVar4 = (this->fBlockSize).fNElements;
  if (lVar4 == 0) {
    pcVar5 = "TPZBlockDiagonal::PutVal called with parameters out of range\n";
    lVar4 = 0x3d;
  }
  else {
    lVar2 = 0;
    lVar8 = 0;
    do {
      lVar7 = lVar8;
      lVar6 = lVar2;
      lVar3 = (long)(this->fBlockSize).fStore[lVar6];
      lVar8 = lVar7 + lVar3;
      if (lVar4 <= lVar6) break;
      lVar2 = lVar6 + 1;
    } while (lVar8 <= row);
    if (lVar4 + 1 != lVar6 + 1) {
      dVar1 = *value;
      if (col < lVar7 || lVar8 <= col) {
        if ((dVar1 != 0.0) || (NAN(dVar1))) {
          pcVar5 = "TPZBlockDiagonal::PutVal, indices row col out of range\n";
          lVar4 = 0x37;
          goto LAB_00bb72ff;
        }
      }
      else {
        (this->fStorage).fStore
        [(row - lVar7) + (this->fBlockPos).fStore[lVar6] + (col - lVar7) * lVar3] = dVar1;
      }
      return 0;
    }
    pcVar5 = "TPZBlockDiagonal::PutVal wrong data structure\n";
    lVar4 = 0x2e;
  }
LAB_00bb72ff:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar5,lVar4);
  return -1;
}

Assistant:

TPZBlockDiagonal<TVar>::~TPZBlockDiagonal ()
{
}